

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwen2vl-cli.cpp
# Opt level: O0

bool eval_tokens(llama_context *ctx_llama,vector<int,_std::allocator<int>_> *tokens,int n_batch,
                int *n_past,int *st_pos_id)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  int *piVar4;
  common_log *log;
  int *in_RCX;
  int in_EDX;
  int iVar5;
  vector<int,_std::allocator<int>_> *in_RSI;
  undefined8 in_RDI;
  int *in_R8;
  int j;
  llama_batch batch;
  int n_eval;
  int i;
  vector<int,_std::allocator<int>_> pos;
  int N;
  int in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  int local_b8;
  int in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 local_70;
  undefined8 uStack_68;
  int local_58;
  uint local_54;
  vector<int,_std::allocator<int>_> local_50;
  uint local_34;
  int *local_30;
  int *local_28;
  int local_1c;
  undefined8 local_10;
  byte local_1;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_10 = in_RDI;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  local_34 = (uint)sVar2;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1855e9);
  local_54 = 0;
  uStack_e0 = in_stack_fffffffffffffeb0;
  uStack_dc = in_stack_fffffffffffffeb4;
  do {
    if ((int)local_34 <= (int)local_54) {
      local_1 = 1;
LAB_001858de:
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)CONCAT44(uStack_dc,uStack_e0));
      return (bool)(local_1 & 1);
    }
    sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
    local_58 = (int)sVar2 - local_54;
    if (local_1c < local_58) {
      local_58 = local_1c;
    }
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)(int)local_54);
    llama_batch_get_one(&stack0xffffffffffffff70,pvVar3,local_58);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    __first._M_current._4_4_ = uStack_dc;
    __first._M_current._0_4_ = uStack_e0;
    __last._M_current._4_4_ = in_stack_fffffffffffffeac;
    __last._M_current._0_4_ = in_stack_fffffffffffffea8;
    std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
              (__first,__last,(int *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    in_stack_fffffffffffffe98 = in_stack_ffffffffffffff70;
    in_stack_fffffffffffffe9c = in_stack_ffffffffffffff74;
    for (local_b8 = 0;
        SBORROW4(local_b8,in_stack_fffffffffffffe98 * 3) !=
        local_b8 + in_stack_fffffffffffffe98 * -3 < 0; local_b8 = local_b8 + 1) {
      iVar1 = *local_30;
      iVar5 = local_b8 % in_stack_fffffffffffffe98;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_50,(long)local_b8);
      *pvVar3 = iVar1 + iVar5;
    }
    piVar4 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x185781);
    uStack_f0 = (undefined4)uStack_88;
    uStack_ec = (undefined4)((ulong)uStack_88 >> 0x20);
    local_e8 = (undefined4)local_80;
    uStack_e4 = (undefined4)((ulong)local_80 >> 0x20);
    uStack_e0 = SUB84(piVar4,0);
    uStack_dc = (undefined4)((ulong)piVar4 >> 0x20);
    local_d8 = (undefined4)local_70;
    uStack_d4 = (undefined4)((ulong)local_70 >> 0x20);
    uStack_d0 = (undefined4)uStack_68;
    uStack_cc = (undefined4)((ulong)uStack_68 >> 0x20);
    in_stack_ffffffffffffff70 = in_stack_fffffffffffffe98;
    in_stack_ffffffffffffff74 = in_stack_fffffffffffffe9c;
    iVar1 = llama_decode(local_10);
    if (iVar1 != 0) {
      if (-1 < common_log_verbosity_thold) {
        log = common_log_main();
        common_log_add(log,GGML_LOG_LEVEL_ERROR,
                       "%s : failed to eval. token %d/%d (batch size %d, n_past %d)\n","eval_tokens"
                       ,(ulong)local_54,(ulong)local_34,local_1c,*local_28);
      }
      local_1 = 0;
      goto LAB_001858de;
    }
    *local_28 = local_58 + *local_28;
    *local_30 = local_58 + *local_30;
    local_54 = local_1c + local_54;
    in_stack_fffffffffffffea0 = uStack_f0;
    in_stack_fffffffffffffea4 = uStack_ec;
    in_stack_fffffffffffffea8 = local_e8;
    in_stack_fffffffffffffeac = uStack_e4;
    in_stack_fffffffffffffeb8 = local_d8;
    in_stack_fffffffffffffebc = uStack_d4;
    in_stack_fffffffffffffec0 = uStack_d0;
    in_stack_fffffffffffffec4 = uStack_cc;
  } while( true );
}

Assistant:

static bool eval_tokens(struct llama_context * ctx_llama, std::vector<llama_token> tokens, int n_batch, int * n_past, int * st_pos_id) {
    int N = (int) tokens.size();
    std::vector<llama_pos> pos;
    for (int i = 0; i < N; i += n_batch) {
        int n_eval = (int) tokens.size() - i;
        if (n_eval > n_batch) {
            n_eval = n_batch;
        }
        auto batch = llama_batch_get_one(&tokens[i], n_eval);
        // TODO: add mrope pos ids somewhere else
        pos.resize(batch.n_tokens * 4);
        std::fill(pos.begin(), pos.end(), 0);
        for (int j = 0; j < batch.n_tokens * 3; j ++) {
            pos[j] = *st_pos_id + (j % batch.n_tokens);
        }
        batch.pos = pos.data();

        if (llama_decode(ctx_llama, batch)) {
            LOG_ERR("%s : failed to eval. token %d/%d (batch size %d, n_past %d)\n", __func__, i, N, n_batch, *n_past);
            return false;
        }
        *n_past += n_eval;
        *st_pos_id += n_eval;
    }
    return true;
}